

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z80.cpp
# Opt level: O0

void Z80::OpCode_Next_MUL(void)

{
  bool bVar1;
  int iVar2;
  Z80Reg ZVar3;
  Z80Reg local_18;
  int iStack_14;
  Z80Reg r1;
  int e [3];
  
  if (DAT_001e16a8._4_4_ < 1) {
    Error("Z80N instructions are currently disabled",bp,SUPPRESS);
  }
  else {
    _iStack_14 = 0xffffffffffffffff;
    e[0] = -1;
    local_18 = GetRegister(&::lp);
    if (((local_18 == Z80_UNK) && (iVar2 = SkipBlanks(&::lp), iVar2 != 0)) &&
       (bVar1 = Options::noFakes(true), !bVar1)) {
      local_18 = Z80_DE;
    }
    if ((local_18 == Z80_DE) ||
       (((local_18 == Z80_D && (bVar1 = comma(&::lp), bVar1)) &&
        (ZVar3 = GetRegister(&::lp), ZVar3 == Z80_E)))) {
      _iStack_14 = 0x30000000ed;
      EmitBytes(&iStack_14,true);
    }
    else {
      Error("Z80N MUL exist only with \"D,E\" arguments",bp,SUPPRESS);
    }
  }
  return;
}

Assistant:

static void OpCode_Next_MUL() {
		if (Options::syx.IsNextEnabled < 1) {
			Error("Z80N instructions are currently disabled", bp, SUPPRESS);
			return;
		}
		int e[3] { -1, -1, -1 };
		Z80Reg r1 = GetRegister(lp);
		if (Z80_UNK == r1 && SkipBlanks(lp) && !Options::noFakes()) {
			r1 = Z80_DE;	// "mul" without arguments is treated as "fake" "mul de"
		}
		// "mul de" and "mul d,e" are both valid syntax options
		if ((Z80_DE==r1) || (Z80_D==r1 && comma(lp) && Z80_E==GetRegister(lp))) {
			e[0]=0xED;
			e[1]=0x30;
		} else {
			Error("Z80N MUL exist only with \"D,E\" arguments", bp, SUPPRESS);
			return;
		}
		EmitBytes(e, true);
	}